

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

bool QAnyStringView::equal(QAnyStringView lhs,QAnyStringView rhs)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  QLatin1StringView rhs_00;
  QBasicUtf8StringView<false> rhs_01;
  QBasicUtf8StringView<false> rhs_02;
  QBasicUtf8StringView<false> rhs_03;
  QLatin1StringView lhs_00;
  QLatin1StringView lhs_01;
  QLatin1StringView lhs_02;
  QBasicUtf8StringView<false> lhs_03;
  
  uVar3 = lhs.m_size;
  lhs_03.m_data = lhs.field_0;
  uVar2 = rhs.m_size;
  rhs_01.m_data = rhs.field_0;
  uVar4 = uVar3 & 0x3fffffffffffffff;
  rhs_01.m_size = uVar2 & 0x3fffffffffffffff;
  if ((uVar4 != rhs_01.m_size) && (uVar3 < 0x4000000000000000 == uVar2 < 0x4000000000000000)) {
    return false;
  }
  if ((uVar3 & 0xc000000000000000) == 0x4000000000000000) {
    if ((uVar2 & 0xc000000000000000) != 0x4000000000000000) {
      lhs_01.m_data = lhs_03.m_data;
      lhs_01.m_size = uVar4;
      bVar1 = QtPrivate::equalStrings(lhs_01,rhs_01);
      return bVar1;
    }
    rhs_00.m_data = rhs_01.m_data;
    rhs_00.m_size = 0x4000000000000000;
    lhs_00.m_data = lhs_03.m_data;
    lhs_00.m_size = uVar4;
    bVar1 = QtPrivate::equalStrings(lhs_00,rhs_00);
    return bVar1;
  }
  if ((uVar2 & 0xc000000000000000) != 0x4000000000000000) {
    rhs_03.m_size = rhs_01.m_size;
    rhs_03.m_data = (storage_type *)rhs_01.m_data;
    lhs_03.m_size = uVar4;
    bVar1 = QtPrivate::equalStrings(lhs_03,rhs_03);
    return bVar1;
  }
  rhs_02.m_size = uVar4;
  rhs_02.m_data = (storage_type *)lhs_03.m_data;
  lhs_02.m_data = rhs_01.m_data;
  lhs_02.m_size = rhs_01.m_size;
  bVar1 = QtPrivate::equalStrings(lhs_02,rhs_02);
  return bVar1;
}

Assistant:

bool QAnyStringView::equal(QAnyStringView lhs, QAnyStringView rhs) noexcept
{
    if (lhs.size() != rhs.size() && lhs.isUtf8() == rhs.isUtf8())
        return false;
    return lhs.visit([rhs](auto lhs) {
        return rhs.visit([lhs](auto rhs) {
            return QtPrivate::equalStrings(lhs, rhs);
        });
    });
}